

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-recall.c
# Opt level: O0

void recall_display(menu_conflict *menu,int oid,_Bool cursor,int row,int col,int width)

{
  locality locality_00;
  uint uVar1;
  uint8_t attr_00;
  void *pvVar2;
  char *pcVar3;
  int level;
  int locality;
  uint8_t attr;
  char place [30];
  int idx;
  uint16_t *choice;
  int width_local;
  int col_local;
  int row_local;
  _Bool cursor_local;
  int oid_local;
  menu_conflict *menu_local;
  
  pvVar2 = menu_priv(menu);
  register0x00000000 = (uint)*(ushort *)((long)pvVar2 + (long)oid * 2);
  attr_00 = '\x01';
  if (cursor) {
    attr_00 = '\x0e';
  }
  if ((int)register0x00000000 < num_recall_points) {
    locality_00 = world->levels[player->recall[(int)register0x00000000]].locality;
    uVar1 = world->levels[player->recall[(int)register0x00000000]].depth;
    if (uVar1 == 0) {
      if (locality_00 == LOC_ARENA) {
        my_strcpy((char *)&locality,"No location set     ",0x1e);
      }
      else {
        pcVar3 = locality_name(locality_00);
        pcVar3 = format("%s Town   ",pcVar3);
        my_strcpy((char *)&locality,pcVar3,0x1e);
      }
    }
    else {
      pcVar3 = locality_name(locality_00);
      pcVar3 = format("%s %d   ",pcVar3,(ulong)uVar1);
      my_strcpy((char *)&locality,pcVar3,0x1e);
    }
  }
  else {
    my_strcpy((char *)&locality,"Don\'t replace     ",0x1e);
  }
  pcVar3 = format("%s",&locality);
  c_put_str(attr_00,pcVar3,row,col);
  return;
}

Assistant:

static void recall_display(struct menu *menu, int oid, bool cursor, int row,
					int col, int width)
{
	const uint16_t *choice = menu_priv(menu);
	int idx = choice[oid];
	char place[30];

	uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);

	if (idx < num_recall_points) {
		int locality = world->levels[player->recall[idx]].locality;
		int level = world->levels[player->recall[idx]].depth;

		/* Get the recall point description */
		if (level) {
			my_strcpy(place, format("%s %d   ", locality_name(locality), level),
					  sizeof(place));
		} else if (locality != LOC_ARENA) {
			my_strcpy(place, format("%s Town   ", locality_name(locality)),
					  sizeof(place));
		} else {
		    my_strcpy(place, "No location set     ", sizeof(place));
		}
	} else {
		my_strcpy(place, "Don't replace     ", sizeof(place));
	}

	/* Print it */
	c_put_str(attr, format("%s", place), row, col);
}